

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O3

Int __thiscall
ipx::LpSolver::LoadIPMStartingPoint
          (LpSolver *this,double *x,double *xl,double *xu,double *slack,double *y,double *zl,
          double *zu)

{
  int iVar1;
  Int IVar2;
  double *pdVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  
  iVar1 = (this->model_).num_rows_;
  sVar6 = (size_t)iVar1;
  sVar5 = (long)(this->model_).num_cols_ + sVar6;
  pdVar3 = (this->x_start_)._M_data;
  if ((this->x_start_)._M_size != sVar5) {
    operator_delete(pdVar3);
    (this->x_start_)._M_size = sVar5;
    pdVar3 = (double *)operator_new(sVar5 * 8);
    (this->x_start_)._M_data = pdVar3;
  }
  iVar4 = (int)sVar5;
  if (iVar4 != 0) {
    memset(pdVar3,0,sVar5 * 8);
  }
  pdVar3 = (this->xl_start_)._M_data;
  if ((this->xl_start_)._M_size != sVar5) {
    operator_delete(pdVar3);
    (this->xl_start_)._M_size = sVar5;
    pdVar3 = (double *)operator_new(sVar5 * 8);
    (this->xl_start_)._M_data = pdVar3;
  }
  if (iVar4 != 0) {
    memset(pdVar3,0,sVar5 * 8);
  }
  pdVar3 = (this->xu_start_)._M_data;
  if ((this->xu_start_)._M_size != sVar5) {
    operator_delete(pdVar3);
    (this->xu_start_)._M_size = sVar5;
    pdVar3 = (double *)operator_new(sVar5 * 8);
    (this->xu_start_)._M_data = pdVar3;
  }
  if (iVar4 != 0) {
    memset(pdVar3,0,sVar5 * 8);
  }
  pdVar3 = (this->y_start_)._M_data;
  if ((this->y_start_)._M_size != sVar6) {
    operator_delete(pdVar3);
    (this->y_start_)._M_size = sVar6;
    pdVar3 = (double *)operator_new(sVar6 * 8);
    (this->y_start_)._M_data = pdVar3;
  }
  if (iVar1 != 0) {
    memset(pdVar3,0,sVar6 << 3);
  }
  pdVar3 = (this->zl_start_)._M_data;
  if ((this->zl_start_)._M_size != sVar5) {
    operator_delete(pdVar3);
    (this->zl_start_)._M_size = sVar5;
    pdVar3 = (double *)operator_new(sVar5 * 8);
    (this->zl_start_)._M_data = pdVar3;
  }
  if (iVar4 != 0) {
    memset(pdVar3,0,sVar5 * 8);
  }
  pdVar3 = (this->zu_start_)._M_data;
  if ((this->zu_start_)._M_size != sVar5) {
    operator_delete(pdVar3);
    (this->zu_start_)._M_size = sVar5;
    pdVar3 = (double *)operator_new(sVar5 * 8);
    (this->zu_start_)._M_data = pdVar3;
  }
  if (iVar4 != 0) {
    memset(pdVar3,0,sVar5 * 8);
  }
  IVar2 = Model::PresolveIPMStartingPoint
                    (&this->model_,x,xl,xu,slack,y,zl,zu,&this->x_start_,&this->xl_start_,
                     &this->xu_start_,&this->y_start_,&this->zl_start_,&this->zu_start_);
  if (IVar2 == 0) {
    MakeIPMStartingPointValid(this);
  }
  else {
    ClearIPMStartingPoint(this);
  }
  return IVar2;
}

Assistant:

Int LpSolver::LoadIPMStartingPoint(const double* x, const double* xl,
                                   const double* xu, const double* slack,
                                   const double* y, const double* zl,
                                   const double* zu) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    x_start_.resize(n+m);
    xl_start_.resize(n+m);
    xu_start_.resize(n+m);
    y_start_.resize(m);
    zl_start_.resize(n+m);
    zu_start_.resize(n+m);
    Int errflag = model_.PresolveIPMStartingPoint(x, xl, xu, slack, y, zl, zu,
                                                  x_start_, xl_start_,
                                                  xu_start_, y_start_,
                                                  zl_start_, zu_start_);
    if (errflag) {
        ClearIPMStartingPoint();
        return errflag;
    }
    MakeIPMStartingPointValid();
    return 0;
}